

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O0

CNscPStackEntry *
NscBuildConditional(CNscPStackEntry *pSelect,CNscPStackEntry *p1,CNscPStackEntry *p2)

{
  bool bVar1;
  NscType NVar2;
  NscType NVar3;
  CNscPStackEntry *pCVar4;
  CNscPStackEntry *in_RDX;
  CNscPStackEntry *in_RSI;
  CNscPStackEntry *in_RDI;
  CNsc5BlockHelper sBlock5;
  CNsc5BlockHelper sBlock4;
  CNsc5BlockHelper sBlock2;
  CNscPStackEntry *pOut;
  undefined4 in_stack_fffffffffffffe98;
  NscType in_stack_fffffffffffffe9c;
  CNscContext *in_stack_fffffffffffffea0;
  CNscPStackEntry *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  undefined4 in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 in_stack_ffffffffffffff14;
  int nLine3;
  CNscPStackEntry *pCVar5;
  int in_stack_ffffffffffffff38;
  uchar *in_stack_ffffffffffffff48;
  uchar *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff58;
  int local_a4;
  int in_stack_ffffffffffffff60;
  int local_98;
  uchar *local_90;
  undefined4 local_88;
  int local_84;
  CNscContext *local_78;
  size_t local_70;
  undefined4 local_64;
  
  pCVar4 = CNscContext::GetPStackEntry
                     (in_stack_fffffffffffffea0,
                      (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),0);
  bVar1 = CNscContext::IsPhase2(g_pCtx);
  if ((bVar1) || (bVar1 = CNscContext::IsNWScript(g_pCtx), bVar1)) {
    NVar2 = CNscPStackEntry::GetType(in_RDI);
    if (((NVar2 == NscType_Error) ||
        (NVar2 = CNscPStackEntry::GetType(in_RSI), NVar2 == NscType_Error)) ||
       (NVar2 = CNscPStackEntry::GetType(in_RDX), NVar2 == NscType_Error)) {
      CNscPStackEntry::SetType
                ((CNscPStackEntry *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
      local_78 = in_stack_fffffffffffffea0;
    }
    else {
      NVar2 = CNscPStackEntry::GetType(in_RDI);
      if (NVar2 == NscType_Integer) {
        NVar2 = CNscPStackEntry::GetType(in_RSI);
        NVar3 = CNscPStackEntry::GetType(in_RDX);
        if (NVar2 == NVar3) {
          CNsc5BlockHelper::CNsc5BlockHelper
                    ((CNsc5BlockHelper *)
                     CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     in_stack_fffffffffffffea8,(NscPCode5Block *)in_stack_fffffffffffffea0,
                     in_stack_fffffffffffffe9c);
          CNsc5BlockHelper::CNsc5BlockHelper
                    ((CNsc5BlockHelper *)
                     CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     in_stack_fffffffffffffea8,(NscPCode5Block *)in_stack_fffffffffffffea0,
                     in_stack_fffffffffffffe9c);
          CNsc5BlockHelper::CNsc5BlockHelper
                    ((CNsc5BlockHelper *)
                     CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     in_stack_fffffffffffffea8,(NscPCode5Block *)in_stack_fffffffffffffea0,
                     in_stack_fffffffffffffe9c);
          pCVar5 = pCVar4;
          CNscPStackEntry::GetType(in_RSI);
          nLine3 = (int)pCVar5;
          CNscPStackEntry::SetType
                    ((CNscPStackEntry *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
          pCVar5 = pCVar4;
          CNscPStackEntry::GetType(in_RSI);
          in_stack_fffffffffffffe98 = 0xffffffff;
          CNscPStackEntry::Push5Block
                    ((CNscPStackEntry *)CONCAT44(in_stack_fffffffffffffed4,0xffffffff),
                     NscPCode_Variable,NscType_Unknown,(uchar *)0x0,
                     CONCAT44(in_stack_fffffffffffffebc,local_64),in_stack_fffffffffffffeb4,local_98
                     ,local_90,CONCAT44(in_stack_fffffffffffffef4,local_88),local_84,
                     (int)in_stack_ffffffffffffff48,in_stack_ffffffffffffff50,
                     CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff58),local_a4,nLine3,
                     (uchar *)pCVar5,local_70,in_stack_ffffffffffffff38,local_a4,
                     in_stack_ffffffffffffff48,(size_t)in_stack_ffffffffffffff50,
                     in_stack_ffffffffffffff58,in_stack_ffffffffffffff60);
        }
        else {
          CNscContext::GenerateMessage(g_pCtx,NscMessage_ErrorConditionalResultTypesBad);
          CNscPStackEntry::SetType
                    ((CNscPStackEntry *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
          local_78 = in_stack_fffffffffffffea0;
        }
      }
      else {
        CNscContext::GenerateMessage(g_pCtx,NscMessage_ErrorConditionalRequiresInt);
        CNscPStackEntry::SetType
                  ((CNscPStackEntry *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
        local_78 = in_stack_fffffffffffffea0;
      }
    }
    CNscContext::FreePStackEntry
              (local_78,(CNscPStackEntry *)
                        CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    CNscContext::FreePStackEntry
              (local_78,(CNscPStackEntry *)
                        CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    CNscContext::FreePStackEntry
              (local_78,(CNscPStackEntry *)
                        CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  }
  else {
    if (in_RDI != (CNscPStackEntry *)0x0) {
      CNscContext::FreePStackEntry
                (in_stack_fffffffffffffea0,
                 (CNscPStackEntry *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    }
    if (in_RSI != (CNscPStackEntry *)0x0) {
      CNscContext::FreePStackEntry
                (in_stack_fffffffffffffea0,
                 (CNscPStackEntry *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    }
    if (in_RDX != (CNscPStackEntry *)0x0) {
      CNscContext::FreePStackEntry
                (in_stack_fffffffffffffea0,
                 (CNscPStackEntry *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    }
    CNscPStackEntry::SetType((CNscPStackEntry *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c)
    ;
  }
  return pCVar4;
}

Assistant:

YYSTYPE NscBuildConditional (YYSTYPE pSelect, YYSTYPE p1, YYSTYPE p2)
{
	CNscPStackEntry *pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);

	//
	// If this is phase1 and we are in a function, do nothing
	//

	if (!g_pCtx ->IsPhase2 () && !g_pCtx ->IsNWScript ())
	{
		if (pSelect)
			g_pCtx ->FreePStackEntry (pSelect);
		if (p1)
			g_pCtx ->FreePStackEntry (p1);
		if (p2)
			g_pCtx ->FreePStackEntry (p2);
		pOut ->SetType (NscType_Unknown);
		return pOut;
	}
	
	//
	// Check for silent errors
	//

	if (pSelect ->GetType () == NscType_Error ||
		p1 ->GetType () == NscType_Error ||
		p2 ->GetType () == NscType_Error)
	{
		pOut ->SetType (NscType_Error);
	}

	//
	// Validate the types
	//

	else if (pSelect ->GetType () != NscType_Integer)
	{
		g_pCtx ->GenerateMessage (NscMessage_ErrorConditionalRequiresInt);
		pOut ->SetType (NscType_Error);
	}
	else if (p1 ->GetType () != p2 ->GetType ())
	{
		g_pCtx ->GenerateMessage (NscMessage_ErrorConditionalResultTypesBad);
		pOut ->SetType (NscType_Error);
	}

	//
	// Generate the codes
	//

	else
	{
		CNsc5BlockHelper sBlock2 (pSelect, NULL, 1);
		CNsc5BlockHelper sBlock4 (p1, NULL, 3);
		CNsc5BlockHelper sBlock5 (p2, NULL, 4);

		pOut ->SetType (p1 ->GetType ());
		pOut ->Push5Block (NscPCode_Conditional, p1 ->GetType (),
			NULL, 0, -1, -1,
			sBlock2 .m_pauchData, sBlock2 .m_ulSize, sBlock2 .m_nFile, sBlock2 .m_nLine,
			NULL, 0, -1, -1, 
			sBlock4 .m_pauchData, sBlock4 .m_ulSize, sBlock4 .m_nFile, sBlock4 .m_nLine,
			sBlock5 .m_pauchData, sBlock5 .m_ulSize, sBlock5 .m_nFile, sBlock5 .m_nLine);
	}

	//
	// Return results
	//

	g_pCtx ->FreePStackEntry (pSelect);
	g_pCtx ->FreePStackEntry (p1);
	g_pCtx ->FreePStackEntry (p2);
	return pOut;
}